

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_7::Validator::CheckLimits
          (Validator *this,Location *loc,Limits *limits,uint64_t absolute_max,char *desc)

{
  ulong uVar1;
  
  if (absolute_max < limits->initial) {
    PrintError(this,loc,"initial %s (%lu) must be <= (%lu)",desc,limits->initial,absolute_max);
  }
  if (limits->has_max == true) {
    uVar1 = limits->max;
    if (absolute_max < uVar1) {
      PrintError(this,loc,"max %s (%lu) must be <= (%lu)",desc,uVar1,absolute_max);
      uVar1 = limits->max;
    }
    if (uVar1 < limits->initial) {
      PrintError(this,loc,"max %s (%lu) must be >= initial %s (%lu)",desc,uVar1,desc,limits->initial
                );
    }
  }
  return;
}

Assistant:

void Validator::CheckLimits(const Location* loc,
                            const Limits* limits,
                            uint64_t absolute_max,
                            const char* desc) {
  if (limits->initial > absolute_max) {
    PrintError(loc, "initial %s (%" PRIu64 ") must be <= (%" PRIu64 ")", desc,
               limits->initial, absolute_max);
  }

  if (limits->has_max) {
    if (limits->max > absolute_max) {
      PrintError(loc, "max %s (%" PRIu64 ") must be <= (%" PRIu64 ")", desc,
                 limits->max, absolute_max);
    }

    if (limits->max < limits->initial) {
      PrintError(loc,
                 "max %s (%" PRIu64 ") must be >= initial %s (%" PRIu64 ")",
                 desc, limits->max, desc, limits->initial);
    }
  }
}